

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasRepeatedFields(Descriptor *descriptor)

{
  bool bVar1;
  long lVar2;
  Descriptor *descriptor_00;
  ulong uVar3;
  ulong uVar4;
  
  if (0 < (long)*(int *)(descriptor + 4)) {
    lVar2 = 0;
    do {
      if ((~*(byte *)(*(long *)(descriptor + 0x28) + 1 + lVar2) & 0x60) == 0) {
        return true;
      }
      lVar2 = lVar2 + 0x48;
    } while ((long)*(int *)(descriptor + 4) * 0x48 != lVar2);
  }
  uVar3 = (ulong)*(int *)(descriptor + 0x70);
  if ((long)uVar3 < 1) {
    bVar1 = false;
  }
  else {
    descriptor_00 = *(Descriptor **)(descriptor + 0x38);
    uVar4 = 0;
    do {
      bVar1 = HasRepeatedFields(descriptor_00);
      if (bVar1) {
        return true;
      }
      uVar4 = uVar4 + 1;
      descriptor_00 = descriptor_00 + 0x88;
    } while (uVar3 != uVar4);
    bVar1 = uVar4 < uVar3;
  }
  return bVar1;
}

Assistant:

static bool HasRepeatedFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (descriptor->field(i)->label() == FieldDescriptor::LABEL_REPEATED) {
      return true;
    }
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasRepeatedFields(descriptor->nested_type(i))) return true;
  }
  return false;
}